

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerScaledAngles
          (IntrinsicGeometryInterface *this)

{
  ParentMeshT *pPVar1;
  size_t sVar2;
  bool bVar3;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2;
  Vertex local_a0;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> local_90;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> local_78;
  MeshData<geometrycentral::surface::Corner,_double> local_60;
  
  DependentQuantity::ensureHave(&(this->cornerAnglesQ).super_DependentQuantity);
  DependentQuantity::ensureHave(&(this->vertexAngleSumsQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Corner,_double>::MeshData
            (&local_60,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Corner,_double>::operator=(&this->cornerScaledAngles,&local_60)
  ;
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData(&local_60);
  local_60.mesh = (this->super_BaseGeometryInterface).mesh;
  local_60.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)(local_60.mesh)->nHalfedgesFillCount;
  local_60.defaultValue = 0.0;
  RangeSetBase<geometrycentral::surface::CornerRangeF>::begin
            (&local_90,(RangeSetBase<geometrycentral::surface::CornerRangeF> *)&local_60);
  RangeSetBase<geometrycentral::surface::CornerRangeF>::end
            (&local_78,(RangeSetBase<geometrycentral::surface::CornerRangeF> *)&local_60);
  while (sVar2 = local_90.iCurr, pPVar1 = local_90.mesh, local_90.iCurr != local_78.iCurr) {
    local_a0.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
    ind = ((local_90.mesh)->heVertexArr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[local_90.iCurr];
    local_a0.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
    mesh = local_90.mesh;
    bVar3 = Vertex::isBoundary(&local_a0);
    (this->cornerScaledAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data[sVar2] =
         ((double)((ulong)bVar3 * 0x400921fb54442d18 + (ulong)!bVar3 * 0x401921fb54442d18) /
         (this->vertexAngleSums).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
         .m_storage.m_data
         [(pPVar1->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar2]]) *
         (this->cornerAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data[sVar2];
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++(&local_90);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeCornerScaledAngles() {
  cornerAnglesQ.ensureHave();
  vertexAngleSumsQ.ensureHave();

  cornerScaledAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    if (c.vertex().isBoundary()) {
      double s = PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    } else {
      double s = 2.0 * PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    }
  }
}